

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

int __thiscall hta::storage::file::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  logic_error *this_00;
  undefined4 in_ECX;
  undefined1 local_e1;
  unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_> local_e0;
  undefined1 local_d1;
  unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_> local_d0;
  undefined4 local_c8;
  undefined1 local_c1;
  unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_>
  local_c0 [7];
  filesystem_error *e;
  path local_78;
  undefined1 local_50 [8];
  path path;
  Mode mode_local;
  string *name_local;
  Directory *this_local;
  
  path._36_4_ = in_ECX;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,___oflag,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/
            ((path *)local_50,(path *)(__file + 8),(path *)&local_78);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_78);
  std::filesystem::create_directory((path *)local_50);
  if (path._36_4_ == 0) {
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path&>
              ((Read *)local_c0,(path *)&local_c1);
    std::unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>>::
    unique_ptr<hta::storage::file::Metric,std::default_delete<hta::storage::file::Metric>,void>
              ((unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>> *)this,
               local_c0);
    std::unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_>::
    ~unique_ptr(local_c0);
  }
  else if (path._36_4_ == 1) {
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path&,hta::Meta&>
              ((Write *)&local_d0,(path *)&local_d1,(Meta *)local_50);
    std::unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>>::
    unique_ptr<hta::storage::file::Metric,std::default_delete<hta::storage::file::Metric>,void>
              ((unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>> *)this,
               &local_d0);
    std::unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_>::
    ~unique_ptr(&local_d0);
  }
  else {
    if (path._36_4_ != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"unknown OpenMode");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::
    make_unique<hta::storage::file::Metric,hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path&,hta::Meta&>
              ((ReadWrite *)&local_e0,(path *)&local_e1,(Meta *)local_50);
    std::unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>>::
    unique_ptr<hta::storage::file::Metric,std::default_delete<hta::storage::file::Metric>,void>
              ((unique_ptr<hta::storage::Metric,std::default_delete<hta::storage::Metric>> *)this,
               &local_e0);
    std::unique_ptr<hta::storage::file::Metric,_std::default_delete<hta::storage::file::Metric>_>::
    ~unique_ptr(&local_e0);
  }
  local_c8 = 1;
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)local_50);
  return (int)this;
}

Assistant:

std::unique_ptr<storage::Metric> Directory::open(const std::string& name, Mode mode, Meta meta)
{
    auto path = directory_ / std::filesystem::path(name);
    // Don't do that in the metric itself (member initialization before constructor body)
    try
    {
        // We do not recursively create the directory
        // to avoid creating fresh databases in unmounted filesystems
        std::filesystem::create_directory(path);
    }
    catch (const std::filesystem::filesystem_error& e)
    {
        throw_exception(
            "Failed to create metric directory. Make sure the parent directory exists. ", path,
            ": ", e.what());
    }
    switch (mode)
    {
    case Mode::read:
        return std::make_unique<Metric>(FileOpenTag::Read(), path);
    case Mode::write:
        return std::make_unique<Metric>(FileOpenTag::Write(), path, meta);
    case Mode::read_write:
        return std::make_unique<Metric>(FileOpenTag::ReadWrite(), path, meta);
    default:
        throw std::logic_error("unknown OpenMode");
    }
}